

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

DVector2 FindRefPoint(line_t *ld,DVector2 *pos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  vertex_t *in_XMM0_Qa;
  vertex_t *pvVar5;
  double dVar6;
  vertex_t *in_XMM1_Qa;
  vertex_t *pvVar7;
  DVector2 DVar8;
  
  dVar1 = pos[7].Y;
  if ((((*(double *)((long)dVar1 + 0xb0) == 0.0) && (!NAN(*(double *)((long)dVar1 + 0xb0)))) &&
      (*(double *)((long)dVar1 + 0xb8) == 0.0)) && (!NAN(*(double *)((long)dVar1 + 0xb8)))) {
    dVar2 = pos[8].X;
    if ((((((*(double *)((long)dVar2 + 0xb0) == 0.0) && (!NAN(*(double *)((long)dVar2 + 0xb0)))) &&
          ((*(double *)((long)dVar2 + 0xb8) == 0.0 &&
           ((!NAN(*(double *)((long)dVar2 + 0xb8)) && (*(double *)((long)dVar1 + 0xd8) == 0.0))))))
         && (!NAN(*(double *)((long)dVar1 + 0xd8)))) &&
        ((((*(double *)((long)dVar1 + 0xe0) == 0.0 && (!NAN(*(double *)((long)dVar1 + 0xe0)))) &&
          (*(double *)((long)dVar2 + 0xd8) == 0.0)) &&
         ((!NAN(*(double *)((long)dVar2 + 0xd8)) && (*(double *)((long)dVar2 + 0xe0) == 0.0)))))) &&
       (((!NAN(*(double *)((long)dVar2 + 0xe0)) &&
         ((*(int *)(*(long *)((long)dVar2 + 0x210) + 0x7c) == 0 &&
          (*(int *)(*(long *)((long)dVar1 + 0x210) + 0x7c) == 0)))) &&
        (((*(uint *)((long)dVar1 + 0x90) & 0x1d0) != 0x100 &&
         (pvVar7 = in_XMM1_Qa, (*(uint *)((long)dVar1 + 0x38) & 0x1d0) != 0x100))))))
    goto LAB_00415e8e;
  }
  dVar1 = *(double *)pos->X;
  dVar2 = ((double *)pos->X)[1];
  dVar3 = pos[1].X;
  dVar4 = pos[1].Y;
  pvVar5 = (vertex_t *)
           ((((double)in_XMM0_Qa - dVar1) * dVar3 + dVar4 * ((double)in_XMM1_Qa - dVar2)) /
           (dVar4 * dVar4 + dVar3 * dVar3));
  pvVar7 = (vertex_t *)0x3ff0000000000000;
  if ((double)pvVar5 <= 1.0) {
    pvVar7 = pvVar5;
  }
  dVar6 = (double)(-(ulong)(0.0 < (double)pvVar5) & (ulong)pvVar7);
  in_XMM0_Qa = (vertex_t *)(dVar6 * dVar3 + dVar1);
  in_XMM1_Qa = (vertex_t *)(dVar6 * dVar4 + dVar2);
LAB_00415e8e:
  ld->v1 = in_XMM0_Qa;
  ld->v2 = in_XMM1_Qa;
  DVar8.Y = (double)pvVar7;
  DVar8.X = (double)in_XMM0_Qa;
  return DVar8;
}

Assistant:

static DVector2 FindRefPoint(line_t *ld, const DVector2 &pos)
{
	// If there's any chance of slopes getting in the way we need to get a proper refpoint, otherwise we can save the work.
	// Slopes can get in here when:
	// - the actual sector planes are sloped
	// - there's 3D floors in this sector
	// - there's a crossable floor portal (for which the dropoff needs to be calculated within P_LineOpening, and the lower sector can easily have slopes)
	//
	// Todo: check if this bootload of checks even helps or if it adds more than it saves
	//
	if 	(ld->frontsector->floorplane.isSlope() ||
			ld->backsector->floorplane.isSlope() ||
			ld->frontsector->ceilingplane.isSlope() ||
			ld->backsector->ceilingplane. isSlope() ||
			ld->backsector->e->XFloor.ffloors.Size() != 0 ||
			ld->frontsector->e->XFloor.ffloors.Size() != 0 ||
			!ld->frontsector->PortalBlocksMovement(sector_t::ceiling) ||
			!ld->frontsector->PortalBlocksMovement(sector_t::floor))
	{

		DVector2 v1 = ld->v1->fPos();
		DVector2 d = ld->Delta();
		double r = clamp(((pos.X - v1.X) * d.X + (pos.Y - v1.Y) * d.Y) / (d.X*d.X + d.Y*d.Y), 0., 1.);
		return v1 + d*r;
	}
	return pos;
}